

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::~ScriptContext(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  ThreadContext *pTVar4;
  CriticalSection *cs;
  undefined4 *puVar5;
  ArenaAllocator *allocator;
  JavascriptLibrary *this_00;
  JITManager *pJVar6;
  nullptr_t local_28;
  byte local_19;
  bool closed;
  AutoCriticalSection autocs;
  ScriptContext *this_local;
  
  (this->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)&PTR_GetNullAddr_01de1800;
  autocs.cs = (CriticalSection *)this;
  pTVar4 = GetThreadContext(this);
  cs = ThreadContext::GetFunctionBodyLock(pTVar4);
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&stack0xffffffffffffffe8,cs);
  ClearHostScriptContext(this);
  if ((this->hasProtoOrStoreFieldInlineCache & 1U) != 0) {
    ThreadContext::ClearInlineCaches(this->threadContext);
    ClearInlineCaches(this);
    if ((this->hasProtoOrStoreFieldInlineCache & 1U) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1b8,"(!this->hasProtoOrStoreFieldInlineCache)",
                                  "!this->hasProtoOrStoreFieldInlineCache");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if ((this->hasIsInstInlineCache & 1U) != 0) {
    ThreadContext::ClearIsInstInlineCaches(this->threadContext);
    ClearIsInstInlineCaches(this);
    if ((this->hasIsInstInlineCache & 1U) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1c0,"(!this->hasIsInstInlineCache)",
                                  "!this->hasIsInstInlineCache");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if ((((this->super_ScriptContextBase).isClosed & 1U) != 0) &&
     ((this->isScriptContextActuallyClosed & 1U) == 0)) {
    ThreadContext::RemoveFromPendingClose(this->threadContext,this);
  }
  SetIsClosed(this);
  local_19 = Close(this,true);
  Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::Uninitialize
            (&this->numberAllocator);
  ShutdownClearSourceLists(this);
  if (this->regexStacks != (RegexStacks *)0x0) {
    allocator = RegexAllocator(this);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::RegexStacks>
              (allocator,this->regexStacks);
    this->regexStacks = (RegexStacks *)0x0;
  }
  if ((this->super_ScriptContextBase).javascriptLibrary != (JavascriptLibrary *)0x0) {
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::ScriptContext>::operator=
              (&(((this->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                scriptContext,&local_28);
    if ((local_19 & 1) != 0) {
      bVar2 = IsClosedNativeCodeGenerator(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x1e3,"(this->IsClosedNativeCodeGenerator())",
                                    "this->IsClosedNativeCodeGenerator()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if ((this->super_ScriptContextBase).globalObject != (GlobalObject *)0x0) {
        pTVar4 = GetThreadContext(this);
        bVar2 = ThreadContext::IsJSRT(pTVar4);
        if (!bVar2) {
          this_00 = GetLibrary(this);
          bVar2 = JavascriptLibraryBase::IsChakraEngine(&this_00->super_JavascriptLibraryBase);
          if (!bVar2) {
            Memory::Recycler::RootRelease
                      (this->recycler,(this->super_ScriptContextBase).globalObject,(uint *)0x0);
          }
        }
      }
    }
    (this->super_ScriptContextBase).javascriptLibrary = (JavascriptLibrary *)0x0;
  }
  bVar2 = IsRegistered(this);
  if (bVar2) {
    ThreadContext::UnregisterScriptContext(this->threadContext,this);
  }
  if (this->backgroundParser != (BackgroundParser *)0x0) {
    BackgroundParser::Delete(this->backgroundParser);
    this->backgroundParser = (BackgroundParser *)0x0;
  }
  if (this->debugContext != (DebugContext *)0x0) {
    bVar2 = DebugContext::IsClosed(this->debugContext);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x200,"(this->debugContext->IsClosed())",
                                  "this->debugContext->IsClosed()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::DebugContext>
              (&Memory::HeapAllocator::Instance,this->debugContext);
    this->debugContext = (DebugContext *)0x0;
  }
  if (this->nativeCodeGen != (NativeCodeGenerator *)0x0) {
    DeleteNativeCodeGenerator(this->nativeCodeGen);
    this->nativeCodeGen = (NativeCodeGenerator *)0x0;
  }
  if (this->jitFuncRangeCache != (JITPageAddrToFuncRangeCache *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::JITPageAddrToFuncRangeCache>
              (&Memory::HeapAllocator::Instance,this->jitFuncRangeCache);
    this->jitFuncRangeCache = (JITPageAddrToFuncRangeCache *)0x0;
  }
  if (this->interpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,InterpreterThunkEmitter>
              (&Memory::HeapAllocator::Instance,this->interpreterThunkEmitter);
    this->interpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  }
  if (this->asmJsInterpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,InterpreterThunkEmitter>
              (&Memory::HeapAllocator::Instance,this->asmJsInterpreterThunkEmitter);
    this->asmJsInterpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  }
  if (this->asmJsCodeGenerator != (AsmJsCodeGenerator *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::AsmJsCodeGenerator>
              (&Memory::HeapAllocator::Instance,this->asmJsCodeGenerator);
    this->asmJsCodeGenerator = (AsmJsCodeGenerator *)0x0;
  }
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::Reset
            (&this->weakReferenceDictionaryList);
  if (this->m_remoteScriptContextAddr != (PSCRIPTCONTEXT_HANDLE)0x0) {
    pJVar6 = JITManager::GetJITManager();
    bVar2 = JITManager::IsOOPJITEnabled(pJVar6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x22f,"(JITManager::GetJITManager()->IsOOPJITEnabled())",
                                  "JITManager::GetJITManager()->IsOOPJITEnabled()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pJVar6 = JITManager::GetJITManager();
    HVar3 = JITManager::CleanupScriptContext(pJVar6,&this->m_remoteScriptContextAddr);
    if ((HVar3 == 0) && (this->m_remoteScriptContextAddr != (PSCRIPTCONTEXT_HANDLE)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x232,"(m_remoteScriptContextAddr == nullptr)",
                                  "m_remoteScriptContextAddr == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this->m_remoteScriptContextAddr = (PSCRIPTCONTEXT_HANDLE)0x0;
  }
  bVar2 = IsActuallyClosed(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x238,"(this->IsActuallyClosed())","this->IsActuallyClosed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pTVar4 = GetThreadContext(this);
  pTVar4->closedScriptContextCount = pTVar4->closedScriptContextCount - 1;
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&stack0xffffffffffffffe8);
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::~SListBase
            (&this->weakReferenceDictionaryList);
  CriticalSection::~CriticalSection(&this->debugContextCloseCS);
  Memory::
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  ::~RecyclerRootPtr(&this->sourceList);
  JsUtil::
  BaseHashSet<void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_void_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseHashSet(&this->bindRef);
  Memory::ArenaAllocator::~ArenaAllocator(&this->miscAllocator);
  Memory::ArenaAllocator::~ArenaAllocator(&this->regexAllocator);
  Memory::ArenaAllocator::~ArenaAllocator(&this->sourceCodeAllocator);
  Memory::CacheAllocator::~CacheAllocator(&this->enumeratorCacheAllocator);
  Memory::CacheAllocator::~CacheAllocator(&this->isInstInlineCacheAllocator);
  Memory::InlineCacheAllocator::~InlineCacheAllocator(&this->inlineCacheAllocator);
  Memory::ArenaAllocator::~ArenaAllocator(&this->dynamicProfileInfoAllocator);
  Memory::ArenaAllocator::~ArenaAllocator(&this->generalAllocator);
  Memory::
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
  ::~RecyclerRootPtr(&this->calleeUtf8SourceInfoList);
  ScriptContextOptimizationOverrideInfo::~ScriptContextOptimizationOverrideInfo
            (&this->optimizationOverrides);
  return;
}

Assistant:

ScriptContext::~ScriptContext()
    {
        // Take etw rundown lock on this thread context. We are going to change/destroy this scriptContext.
        AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());

        // TODO: Can we move this on Close()?
        ClearHostScriptContext();

        if (this->hasProtoOrStoreFieldInlineCache)
        {
            // TODO (PersistentInlineCaches): It really isn't necessary to clear inline caches in all script contexts.
            // Since this script context is being destroyed, the inline cache arena will also go away and release its
            // memory back to the page allocator.  Thus, we cannot leave this script context's inline caches on the
            // thread context's invalidation lists.  However, it should suffice to remove this script context's caches
            // without touching other script contexts' caches.  We could call some form of RemoveInlineCachesFromInvalidationLists()
            // on the inline cache allocator, which would walk all inline caches and zap values pointed to by strongRef.

            // clear out all inline caches to remove our proto inline caches from the thread context
            threadContext->ClearInlineCaches();

            ClearInlineCaches();
            Assert(!this->hasProtoOrStoreFieldInlineCache);
        }

        if (this->hasIsInstInlineCache)
        {
            // clear out all inline caches to remove our proto inline caches from the thread context
            threadContext->ClearIsInstInlineCaches();
            ClearIsInstInlineCaches();
            Assert(!this->hasIsInstInlineCache);
        }

        // Only call RemoveFromPendingClose if we are in a pending close state.
        if (isClosed && !isScriptContextActuallyClosed)
        {
            threadContext->RemoveFromPendingClose(this);
        }

        SetIsClosed();
        bool closed = Close(true);

        // JIT may access number allocator. Need to close the script context first,
        // which will close the native code generator and abort any current job on this generator.
        numberAllocator.Uninitialize();

        ShutdownClearSourceLists();

        if (regexStacks)
        {
            Adelete(RegexAllocator(), regexStacks);
            regexStacks = nullptr;
        }

        if (javascriptLibrary != nullptr)
        {
            javascriptLibrary->scriptContext = nullptr;

            if (closed)
            {
                // if we just closed, we haven't unpin the object yet.
                // We need to null out the script context in the global object first
                // before we unpin the global object so that script context dtor doesn't get called twice

#if ENABLE_NATIVE_CODEGEN
                Assert(this->IsClosedNativeCodeGenerator());
#endif
                if (globalObject && !GetThreadContext()->IsJSRT() && !GetLibrary()->IsChakraEngine())
                {
                    this->recycler->RootRelease(globalObject);
                }
            }

            javascriptLibrary = nullptr;
        }

        // Normally the JavascriptLibraryBase will unregister the scriptContext from the threadContext.
        // In cases where we don't finish initialization e.g. OOM, manually unregister the scriptContext.
        if (this->IsRegistered())
        {
            threadContext->UnregisterScriptContext(this);
        }

#if ENABLE_BACKGROUND_PARSING
        if (this->backgroundParser != nullptr)
        {
            BackgroundParser::Delete(this->backgroundParser);
            this->backgroundParser = nullptr;
        }
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->debugContext != nullptr)
        {
            Assert(this->debugContext->IsClosed());
            HeapDelete(this->debugContext);
            this->debugContext = nullptr;
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (this->nativeCodeGen != nullptr)
        {
            DeleteNativeCodeGenerator(this->nativeCodeGen);
            nativeCodeGen = NULL;
        }
        if (jitFuncRangeCache != nullptr)
        {
            HeapDelete(jitFuncRangeCache);
            jitFuncRangeCache = nullptr;
        }
#endif

#if DYNAMIC_INTERPRETER_THUNK
        if (this->interpreterThunkEmitter != nullptr)
        {
            HeapDelete(interpreterThunkEmitter);
            this->interpreterThunkEmitter = NULL;
        }
#endif

#ifdef ASMJS_PLAT
        if (this->asmJsInterpreterThunkEmitter != nullptr)
        {
            HeapDelete(asmJsInterpreterThunkEmitter);
            this->asmJsInterpreterThunkEmitter = nullptr;
        }

        if (this->asmJsCodeGenerator != nullptr)
        {
            HeapDelete(asmJsCodeGenerator);
            this->asmJsCodeGenerator = NULL;
        }
#endif

        // In case there is something added to the list between close and dtor, just reset the list again
        this->weakReferenceDictionaryList.Reset();

#if ENABLE_NATIVE_CODEGEN
        if (m_remoteScriptContextAddr)
        {
            Assert(JITManager::GetJITManager()->IsOOPJITEnabled());
            if (JITManager::GetJITManager()->CleanupScriptContext(&m_remoteScriptContextAddr) == S_OK)
            {
                Assert(m_remoteScriptContextAddr == nullptr);
            }
            m_remoteScriptContextAddr = nullptr;
        }
#endif

        Assert(this->IsActuallyClosed());
        this->GetThreadContext()->closedScriptContextCount--;

        PERF_COUNTER_DEC(Basic, ScriptContext);
    }